

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

string * cinatra::get_content_type_str_abi_cxx11_(req_content_type type)

{
  undefined4 in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  this = in_RDI;
  std::__cxx11::string::string(in_stack_ffffffffffffffe0);
  switch(in_ESI) {
  case 0:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this,(char *)in_RDI);
    break;
  case 1:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this,(char *)in_RDI);
    break;
  case 2:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this,(char *)in_RDI);
    break;
  case 3:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this,(char *)in_RDI);
    break;
  case 4:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this,(char *)in_RDI);
    break;
  case 6:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this,(char *)in_RDI);
    break;
  case 7:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this,(char *)in_RDI);
    break;
  case 8:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this,(char *)in_RDI);
    break;
  case 9:
  default:
  }
  return this;
}

Assistant:

inline std::string get_content_type_str(req_content_type type) {
  std::string str;
  switch (type) {
    case req_content_type::html:
      str = "text/html; charset=UTF-8";
      break;
    case req_content_type::json:
      str = "application/json; charset=UTF-8";
      break;
    case req_content_type::text:
      str = "text/plain";
      break;
    case req_content_type::string:
      str = "text/html; charset=UTF-8";
      break;
    case req_content_type::multipart:
      str = "multipart/form-data; boundary=";
      break;
    case req_content_type::form_url_encode:
      str = "application/x-www-form-urlencoded";
      break;
    case req_content_type::octet_stream:
      str = "application/octet-stream";
      break;
    case req_content_type::xml:
      str = "application/xml";
      break;
    case req_content_type::none:
    default:
      break;
  }

  return str;
}